

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O0

void __thiscall xray_re::xr_cform::generate_vertex_faces(xr_cform *this)

{
  uint32_t uVar1;
  bool bVar2;
  pointer pcVar3;
  pointer pcVar4;
  reference pvVar5;
  uint32_t *face0;
  uint_fast32_t i;
  cf_face_vec_it end_1;
  cf_face_vec_it it_1;
  iterator iStack_20;
  uint32_t face_idx;
  cf_vertex_vec_it end;
  cf_vertex_vec_it it;
  xr_cform *this_local;
  
  end._M_current =
       (cf_vertex *)
       std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::begin
                 (&this->m_vertices);
  iStack_20 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::end
                        (&this->m_vertices);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffe0);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<xray_re::cf_vertex_*,_std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>_>
             ::operator->(&end);
    pcVar3->face0 = 0xffffffff;
    __gnu_cxx::
    __normal_iterator<xray_re::cf_vertex_*,_std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>_>
    ::operator++(&end);
  }
  it_1._M_current._4_4_ = 0;
  end_1._M_current =
       (cf_face *)
       std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::begin(&this->m_faces);
  i = (uint_fast32_t)
      std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(&this->m_faces);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&end_1,(__normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                               *)&i);
    if (!bVar2) break;
    face0 = (uint32_t *)0x3;
    while (face0 != (uint32_t *)0x0) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end_1);
      pvVar5 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                         (&this->m_vertices,(ulong)*(uint *)((long)pcVar4 + (long)face0 * 4 + -4));
      uVar1 = pvVar5->face0;
      pcVar4 = __gnu_cxx::
               __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end_1);
      *(uint32_t *)((long)&pcVar4->field_0 + (long)face0 * 4 + 8) = uVar1;
      pvVar5->face0 = it_1._M_current._4_4_;
      face0 = (uint32_t *)((long)face0 + -1);
    }
    __gnu_cxx::
    __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
    ::operator++(&end_1);
    it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

void xr_cform::generate_vertex_faces()
{
	for (cf_vertex_vec_it it = m_vertices.begin(), end = m_vertices.end();
			it != end; ++it) {
		it->face0 = BAD_IDX;
	}
	uint32_t face_idx = 0;
	for (cf_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t i = 3; i != 0;) {
			uint32_t& face0 = m_vertices[it->v[--i]].face0;
			it->link[i] = face0;
			face0 = face_idx;
		}
	}
}